

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

void duckdb::ListRangeFunction<duckdb::TimestampRangeInfo,true>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  data_ptr_t pdVar6;
  bool bVar7;
  reference pvVar8;
  uint64_t uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  Vector *pVVar12;
  timestamp_t left;
  idx_t iVar13;
  size_type __n;
  uint64_t *puVar14;
  idx_t row_idx;
  long lVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  INCREMENT_TYPE right;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true> info;
  uint64_t local_178;
  idx_t local_170;
  VectorType local_164;
  long local_150;
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  Vector *local_130;
  data_ptr_t local_128;
  idx_t local_120;
  idx_t local_118;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true> local_110;
  
  RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RangeInfoStruct(&local_110,args);
  local_170 = 1;
  local_164 = CONSTANT_VECTOR;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
      if (pvVar8->vector_type != CONSTANT_VECTOR) {
        local_170 = args->count;
        local_164 = FLAT_VECTOR;
        break;
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_170 == 0) {
    local_178 = 0;
  }
  else {
    puVar14 = (uint64_t *)(pdVar1 + 8);
    uVar16 = 0;
    local_178 = 0;
    do {
      bVar7 = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RowIsValid(&local_110,uVar16);
      if (bVar7) {
        puVar14[-1] = local_178;
        uVar9 = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::ListLength(&local_110,uVar16);
        *puVar14 = uVar9;
        local_178 = local_178 + uVar9;
      }
      else {
        _Var11._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_118 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_148,&local_118);
          p_Var5 = p_Stack_140;
          peVar4 = local_148;
          local_148 = (element_type *)0x0;
          p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
             p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var11._M_head_impl;
        }
        bVar3 = (byte)uVar16 & 0x3f;
        _Var11._M_head_impl[uVar16 >> 6] =
             _Var11._M_head_impl[uVar16 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3)
        ;
        puVar14[-1] = local_178;
        *puVar14 = 0;
      }
      uVar16 = uVar16 + 1;
      puVar14 = puVar14 + 2;
    } while (local_170 != uVar16);
  }
  ListVector::Reserve(result,local_178);
  pVVar12 = ListVector::GetEntry(result);
  if (local_170 != 0) {
    local_128 = pVVar12->data;
    row_idx = 0;
    local_150 = 0;
    local_130 = result;
    do {
      if ((long)((local_110.args)->data).
                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((local_110.args)->data).
                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start == 0x68) {
        left = TimestampRangeInfo::DefaultStart();
      }
      else {
        iVar13 = row_idx;
        if ((local_110.vdata[0].sel)->sel_vector != (sel_t *)0x0) {
          iVar13 = (idx_t)(local_110.vdata[0].sel)->sel_vector[row_idx];
        }
        left.value = *(int64_t *)(local_110.vdata[0].data + iVar13 * 8);
      }
      right = RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::ListIncrementValue
                        (&local_110,row_idx);
      pdVar6 = local_128;
      local_120 = row_idx;
      if (*(long *)(pdVar1 + row_idx * 0x10 + 8) != 0) {
        uVar16 = 0;
        do {
          if (uVar16 != 0) {
            left = Interval::Add(left,right);
          }
          *(int64_t *)(pdVar6 + uVar16 * 8 + local_150 * 8) = left.value;
          uVar16 = uVar16 + 1;
        } while (uVar16 < *(ulong *)(pdVar1 + row_idx * 0x10 + 8));
        local_150 = local_150 + uVar16;
        result = local_130;
      }
      row_idx = local_120 + 1;
    } while (row_idx != local_170);
  }
  ListVector::SetListSize(result,local_178);
  Vector::SetVectorType(result,local_164);
  Vector::Verify(result,args->count);
  lVar15 = 0xd8;
  do {
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_110.vdata + lVar15 + -8)
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar15) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_130 + lVar15));
    }
    lVar15 = lVar15 + -0x48;
  } while (lVar15 != 0);
  return;
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}